

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtSourceHolder.cpp
# Opt level: O0

void __thiscall
Js::
JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
::Unload(JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
         *this)

{
  uchar **ppuVar1;
  nullptr_t local_18;
  JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
  *local_10;
  JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
  *this_local;
  
  if (this->scriptUnloadCallback != (Type)0x0) {
    local_10 = this;
    (*this->scriptUnloadCallback)(this->sourceContext);
    ppuVar1 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                        ((WriteBarrierPtr *)&this->mappedSource);
    if (*ppuVar1 != (uchar *)0x0) {
      ppuVar1 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                          ((WriteBarrierPtr *)&this->mappedSource);
      JsrtSourceHolderPolicy<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*)>::
      FreeMappedSource(*ppuVar1,this->mappedAllocLength);
      local_18 = (nullptr_t)0x0;
      Memory::WriteBarrierPtr<const_unsigned_char>::operator=(&this->mappedSource,&local_18);
    }
    this->scriptLoadCallback = (Type)0x0;
    this->scriptUnloadCallback = (Type)0x0;
    this->sourceContext = 0;
  }
  return;
}

Assistant:

void JsrtSourceHolder<TLoadCallback, TUnloadCallback>::Unload()
    {
        if (scriptUnloadCallback == nullptr)
        {
            return;
        }

        scriptUnloadCallback(sourceContext);

        if (this->mappedSource != nullptr)
        {
            JsrtSourceHolderPolicy<TLoadCallback>::FreeMappedSource(
                this->mappedSource, this->mappedAllocLength);
            this->mappedSource = nullptr;
        }

        // Don't allow load or unload again after told to unload.
        scriptLoadCallback = nullptr;
        scriptUnloadCallback = nullptr;
        sourceContext = NULL;
    }